

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx.c
# Opt level: O2

char * ps_lookup_word(ps_decoder_t *ps,char *word)

{
  dict_t *d;
  s3wid_t wid;
  char *pcVar1;
  size_t sVar2;
  char *__src;
  int pos;
  int iVar3;
  
  d = ps->dict;
  wid = dict_wordid(d,word);
  pcVar1 = (char *)0x0;
  if (wid != -1) {
    iVar3 = 0;
    while (pos = (int)pcVar1, pos < d->word[wid].pronlen) {
      pcVar1 = dict_ciphone_str(d,wid,pos);
      sVar2 = strlen(pcVar1);
      iVar3 = iVar3 + (int)sVar2 + 1;
      pcVar1 = (char *)(ulong)(pos + 1);
    }
    pcVar1 = (char *)__ckd_calloc__(1,(long)iVar3,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/pocketsphinx.c"
                                    ,0x3fd);
    for (iVar3 = 0; iVar3 < d->word[wid].pronlen; iVar3 = iVar3 + 1) {
      __src = dict_ciphone_str(d,wid,iVar3);
      strcat(pcVar1,__src);
      if (iVar3 != d->word[wid].pronlen + -1) {
        sVar2 = strlen(pcVar1);
        (pcVar1 + sVar2)[0] = ' ';
        (pcVar1 + sVar2)[1] = '\0';
      }
    }
  }
  return pcVar1;
}

Assistant:

char *
ps_lookup_word(ps_decoder_t *ps, const char *word)
{
    s3wid_t wid;
    int32 phlen, j;
    char *phones;
    dict_t *dict = ps->dict;
    
    wid = dict_wordid(dict, word);
    if (wid == BAD_S3WID)
	return NULL;

    for (phlen = j = 0; j < dict_pronlen(dict, wid); ++j)
        phlen += strlen(dict_ciphone_str(dict, wid, j)) + 1;
    phones = ckd_calloc(1, phlen);
    for (j = 0; j < dict_pronlen(dict, wid); ++j) {
        strcat(phones, dict_ciphone_str(dict, wid, j));
        if (j != dict_pronlen(dict, wid) - 1)
            strcat(phones, " ");
    }
    return phones;
}